

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
FlowGraph::InsertCompBlockToLoopList
          (FlowGraph *this,Loop *loop,BasicBlock *compBlock,BasicBlock *targetBlock,bool postTarget)

{
  bool bVar1;
  Type *ppBVar2;
  undefined1 local_58 [8];
  EditingIterator iter;
  BasicBlock *compBlock_local;
  
  if (loop != (Loop *)0x0) {
    local_58 = (undefined1  [8])&loop->blockList;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_58;
    iter.super_EditingIterator.last = (NodeBase *)compBlock;
    do {
      bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_58);
      if (!bVar1) goto LAB_00418738;
      ppBVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_58);
    } while ((*ppBVar2 != targetBlock) || ((*(ushort *)&(*ppBVar2)->field_0x18 & 1) != 0));
    if (postTarget) {
      SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                ((EditingIterator *)local_58);
    }
    SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)local_58,
               (ArenaAllocator *)
               (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                ((long)local_58 + 0x10))->super_SListNodeBase<Memory::ArenaAllocator>).next,
               (BasicBlock **)&iter.super_EditingIterator.last);
    compBlock = (BasicBlock *)iter.super_EditingIterator.last;
LAB_00418738:
    InsertCompBlockToLoopList(this,loop->parent,compBlock,targetBlock,postTarget);
  }
  return;
}

Assistant:

void
FlowGraph::InsertCompBlockToLoopList(Loop *loop, BasicBlock* compBlock, BasicBlock* targetBlock, bool postTarget)
{
    if (loop)
    {
        bool found = false;
        FOREACH_BLOCK_IN_LOOP_EDITING(loopBlock, loop, iter)
        {
            if (loopBlock == targetBlock)
            {
                found = true;
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;
        if (found)
        {
            if (postTarget)
            {
                iter.Next();
            }
            iter.InsertBefore(compBlock);
        }
        InsertCompBlockToLoopList(loop->parent, compBlock, targetBlock, postTarget);
    }
}